

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS
ref_interp_enclosing_tet_in_list
          (REF_INTERP ref_interp,REF_LIST ref_list,REF_DBL *xyz,REF_INT *cell,REF_DBL *bary)

{
  REF_INT cell_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_118;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_DBL min_bary;
  REF_DBL best_bary;
  REF_DBL current_bary [4];
  REF_INT best_candidate;
  REF_INT candidate;
  REF_INT item;
  REF_INT nodes [27];
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *bary_local;
  REF_INT *cell_local;
  REF_DBL *xyz_local;
  REF_LIST ref_list_local;
  REF_INTERP ref_interp_local;
  
  ref_cell_00 = ref_interp->from_tet;
  unique0x00012000 = ref_interp->from_grid->node;
  current_bary[3]._4_4_ = -1;
  min_bary = -999.0;
  best_candidate = 0;
  while( true ) {
    if (ref_list->n <= best_candidate) {
      if (current_bary[3]._4_4_ == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x1b4,"ref_interp_enclosing_tet_in_list","failed to find cell");
        ref_interp_local._4_4_ = 1;
      }
      else {
        *cell = current_bary[3]._4_4_;
        ref_interp_local._4_4_ = ref_cell_nodes(ref_cell_00,current_bary[3]._4_4_,&candidate);
        if (ref_interp_local._4_4_ == 0) {
          ref_interp_local._4_4_ = ref_node_bary4(stack0xffffffffffffffb8,&candidate,xyz,bary);
          if (ref_interp_local._4_4_ == 0) {
            ref_interp_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x1b8,"ref_interp_enclosing_tet_in_list",(ulong)ref_interp_local._4_4_,"bary");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x1b7,"ref_interp_enclosing_tet_in_list",(ulong)ref_interp_local._4_4_,"cell");
        }
      }
      return ref_interp_local._4_4_;
    }
    cell_00 = ref_list->value[best_candidate];
    uVar1 = ref_cell_nodes(ref_cell_00,cell_00,&candidate);
    if (uVar1 != 0) break;
    uVar1 = ref_node_bary4(stack0xffffffffffffffb8,&candidate,xyz,&best_bary);
    if ((uVar1 != 0) && (uVar1 != 4)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x1a8,"ref_interp_enclosing_tet_in_list",(ulong)uVar1,"bary");
      return uVar1;
    }
    if (uVar1 == 0) {
      if (current_bary[0] <= best_bary) {
        local_118 = current_bary[0];
      }
      else {
        local_118 = best_bary;
      }
      if (current_bary[2] <= current_bary[1]) {
        local_128 = current_bary[2];
      }
      else {
        local_128 = current_bary[1];
      }
      if (local_128 <= local_118) {
        if (current_bary[2] <= current_bary[1]) {
          local_140 = current_bary[2];
        }
        else {
          local_140 = current_bary[1];
        }
        local_138 = local_140;
      }
      else {
        if (current_bary[0] <= best_bary) {
          local_130 = current_bary[0];
        }
        else {
          local_130 = best_bary;
        }
        local_138 = local_130;
      }
      if ((current_bary[3]._4_4_ == -1) || (min_bary < local_138)) {
        min_bary = local_138;
        current_bary[3]._4_4_ = cell_00;
      }
    }
    best_candidate = best_candidate + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x1a6,
         "ref_interp_enclosing_tet_in_list",(ulong)uVar1,"cell");
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_enclosing_tet_in_list(
    REF_INTERP ref_interp, REF_LIST ref_list, REF_DBL *xyz, REF_INT *cell,
    REF_DBL *bary) {
  REF_CELL ref_cell = ref_interp_from_tet(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, candidate, best_candidate;
  REF_DBL current_bary[4];
  REF_DBL best_bary, min_bary;
  REF_STATUS status;

  best_candidate = REF_EMPTY;
  best_bary = -999.0;
  each_ref_list_item(ref_list, item) {
    candidate = ref_list_value(ref_list, item);
    RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
    status = ref_node_bary4(ref_node, nodes, xyz, current_bary);
    RXS(status, REF_DIV_ZERO, "bary");
    if (REF_SUCCESS == status) { /* exclude REF_DIV_ZERO */

      min_bary = MIN(MIN(current_bary[0], current_bary[1]),
                     MIN(current_bary[2], current_bary[3]));
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }
  }

  RUS(REF_EMPTY, best_candidate, "failed to find cell");

  *cell = best_candidate;
  RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
  RSS(ref_node_bary4(ref_node, nodes, xyz, bary), "bary");

  return REF_SUCCESS;
}